

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_new_session_ticket(ptls_t *tls,ptls_iovec_t message)

{
  _func_int_st_ptls_save_ticket_t_ptr_ptls_t_ptr_ptls_iovec_t *p_Var1;
  st_ptls_save_ticket_t *psVar2;
  size_t sVar3;
  uint8_t *src_00;
  ulong uVar4;
  ptls_iovec_t pVar5;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  undefined1 local_98;
  undefined1 local_97;
  uint16_t _v_2;
  undefined1 local_94;
  undefined1 local_93;
  uint16_t _v_1;
  uint64_t local_90;
  uint64_t _v;
  ptls_buffer_t ticket_buf;
  ptls_iovec_t ticket;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  uint32_t ticket_lifetime;
  int ret;
  ptls_iovec_t ticket_nonce;
  uint8_t *end;
  uint8_t *src;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  src_00 = message.base + 4;
  ticket_nonce.len = (size_t)(message.base + message.len);
  ticket_age_add =
       decode_new_session_ticket
                 (tls,&max_early_data_size,(uint32_t *)((long)&ticket.len + 4),
                  (ptls_iovec_t *)&ticket_lifetime,(ptls_iovec_t *)&ticket_buf.is_allocated,
                  (uint32_t *)&ticket.len,src_00,(uint8_t *)ticket_nonce.len);
  message_local.len._4_4_ = ticket_age_add;
  if (ticket_age_add == 0) {
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      message_local.len._4_4_ = 0;
    }
    else {
      ptls_buffer_init((ptls_buffer_t *)&_v,"",0);
      local_90 = (*tls->ctx->get_time->cb)(tls->ctx->get_time);
      local_98 = (undefined1)(local_90 >> 0x38);
      local_97 = (undefined1)(local_90 >> 0x30);
      _v_2._0_1_ = (undefined1)(local_90 >> 0x28);
      _v_2._1_1_ = (undefined1)(local_90 >> 0x20);
      local_94 = (undefined1)(local_90 >> 0x18);
      local_93 = (undefined1)(local_90 >> 0x10);
      _v_1._0_1_ = (undefined1)(local_90 >> 8);
      _v_1._1_1_ = (undefined1)local_90;
      ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)&_v,&local_98,8);
      if (ticket_age_add == 0) {
        capacity._6_2_ = tls->key_share->id;
        capacity._4_1_ = (undefined1)(capacity._6_2_ >> 8);
        capacity._5_1_ = (undefined1)capacity._6_2_;
        ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)&_v,(void *)((long)&capacity + 4),2)
        ;
        if (ticket_age_add == 0) {
          capacity._2_2_ = tls->cipher_suite->id;
          capacity._0_1_ = (undefined1)(capacity._2_2_ >> 8);
          capacity._1_1_ = (undefined1)capacity._2_2_;
          ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)&_v,&capacity,2);
          if (ticket_age_add == 0) {
            body_start = 3;
            ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)&_v,"",3);
            sVar3 = ticket_buf.capacity;
            if ((ticket_age_add == 0) &&
               (ticket_age_add =
                     ptls_buffer__do_pushv
                               ((ptls_buffer_t *)&_v,src_00,ticket_nonce.len - (long)src_00),
               ticket_age_add == 0)) {
              uVar4 = ticket_buf.capacity - sVar3;
              if (uVar4 < 0x1000000) {
                for (; body_start != 0; body_start = body_start - 1) {
                  *(char *)(_v + (sVar3 - body_start)) =
                       (char)(uVar4 >> (((char)body_start + -1) * '\b' & 0x3fU));
                }
                body_start_1 = 2;
                ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)&_v,"",2);
                sVar3 = ticket_buf.capacity;
                if (((ticket_age_add == 0) &&
                    (ticket_age_add =
                          ptls_buffer_reserve((ptls_buffer_t *)&_v,
                                              (tls->key_schedule->hashes[0].algo)->digest_size),
                    ticket_age_add == 0)) &&
                   (ticket_age_add =
                         derive_resumption_secret
                                   (tls->key_schedule,(uint8_t *)(_v + ticket_buf.capacity),
                                    _ticket_lifetime), ticket_age_add == 0)) {
                  ticket_buf.capacity =
                       (tls->key_schedule->hashes[0].algo)->digest_size + ticket_buf.capacity;
                  uVar4 = ticket_buf.capacity - sVar3;
                  if (uVar4 < 0x10000) {
                    for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                      *(char *)(_v + (sVar3 - body_start_1)) =
                           (char)(uVar4 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                    }
                    p_Var1 = tls->ctx->save_ticket->cb;
                    psVar2 = tls->ctx->save_ticket;
                    pVar5 = ptls_iovec_init((void *)_v,ticket_buf.capacity);
                    ticket_age_add = (*p_Var1)(psVar2,tls,pVar5);
                    if (ticket_age_add == 0) {
                      ticket_age_add = 0;
                    }
                  }
                  else {
                    ticket_age_add = 0x20c;
                  }
                }
              }
              else {
                ticket_age_add = 0x20c;
              }
            }
          }
        }
      }
      ptls_buffer_dispose((ptls_buffer_t *)&_v);
      message_local.len._4_4_ = ticket_age_add;
    }
  }
  return message_local.len._4_4_;
}

Assistant:

static int client_handle_new_session_ticket(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    ptls_iovec_t ticket_nonce;
    int ret;

    { /* verify the format */
        uint32_t ticket_lifetime, ticket_age_add, max_early_data_size;
        ptls_iovec_t ticket;
        if ((ret = decode_new_session_ticket(tls, &ticket_lifetime, &ticket_age_add, &ticket_nonce, &ticket, &max_early_data_size,
                                             src, end)) != 0)
            return ret;
    }

    /* do nothing if use of session ticket is disabled */
    if (tls->ctx->save_ticket == NULL)
        return 0;

    /* save the extension, along with the key of myself */
    ptls_buffer_t ticket_buf;
    ptls_buffer_init(&ticket_buf, "", 0);
    ptls_buffer_push64(&ticket_buf, tls->ctx->get_time->cb(tls->ctx->get_time));
    ptls_buffer_push16(&ticket_buf, tls->key_share->id);
    ptls_buffer_push16(&ticket_buf, tls->cipher_suite->id);
    ptls_buffer_push_block(&ticket_buf, 3, { ptls_buffer_pushv(&ticket_buf, src, end - src); });
    ptls_buffer_push_block(&ticket_buf, 2, {
        if ((ret = ptls_buffer_reserve(&ticket_buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = derive_resumption_secret(tls->key_schedule, ticket_buf.base + ticket_buf.off, ticket_nonce)) != 0)
            goto Exit;
        ticket_buf.off += tls->key_schedule->hashes[0].algo->digest_size;
    });

    if ((ret = tls->ctx->save_ticket->cb(tls->ctx->save_ticket, tls, ptls_iovec_init(ticket_buf.base, ticket_buf.off))) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&ticket_buf);
    return ret;
}